

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall dxil_spv::SPIRVModule::get_builtin_shader_output(SPIRVModule *this,BuiltIn builtin)

{
  Id IVar1;
  pointer this_00;
  BuiltIn builtin_local;
  SPIRVModule *this_local;
  
  this_00 = std::
            unique_ptr<dxil_spv::SPIRVModule::Impl,_std::default_delete<dxil_spv::SPIRVModule::Impl>_>
            ::operator->(&this->impl);
  IVar1 = Impl::get_builtin_shader_output(this_00,builtin);
  return IVar1;
}

Assistant:

spv::Id SPIRVModule::get_builtin_shader_output(spv::BuiltIn builtin)
{
	return impl->get_builtin_shader_output(builtin);
}